

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

table_arrays<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
* boost::unordered::detail::foa::
  table_arrays<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
  ::new_(table_arrays<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
         *__return_storage_ptr__,undefined8 param_2,ulong param_3)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 local_9;
  
  uVar2 = param_3 / 0xf;
  if (uVar2 == 0) {
    uVar1 = 0x40;
  }
  else {
    uVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x3f;
  }
  uVar2 = 0x3f;
  if (0x1d < param_3) {
    uVar2 = uVar1;
  }
  __return_storage_ptr__->groups_size_index = uVar2;
  __return_storage_ptr__->groups_size_mask = ~(-1L << (-(char)uVar2 & 0x3fU));
  __return_storage_ptr__->groups_ = (group_type_pointer)0x0;
  __return_storage_ptr__->elements_ = (value_type_pointer)0x0;
  if (param_3 == 0) {
    __return_storage_ptr__->groups_ =
         (group_type_pointer)
         dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
         ::storage;
  }
  else {
    set_arrays(__return_storage_ptr__,&local_9,param_3);
  }
  return __return_storage_ptr__;
}

Assistant:

static table_arrays new_(allocator_type al, std::size_t n) {
        auto groups_size_index = size_index_for<group_type, size_policy>(n);
        auto groups_size = size_policy::size(groups_size_index);
        table_arrays arrays{groups_size_index, groups_size - 1, nullptr, nullptr};

        set_arrays(arrays, al, n);
        return arrays;
    }